

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

IMutableRegistryHub * Catch::getMutableRegistryHub(void)

{
  if ((anonymous_namespace)::getTheRegistryHub()::theRegistryHub == (undefined8 *)0x0) {
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub = (undefined8 *)operator_new(0xd8);
    *(anonymous_namespace)::getTheRegistryHub()::theRegistryHub = &PTR__RegistryHub_00178c50;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[1] = &PTR__RegistryHub_00178ca0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[2] = &PTR__TestRegistry_00177ea8;
    *(undefined4 *)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 4) = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[5] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[6] =
         (anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 4;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[7] =
         (anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 4;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[8] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[9] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[10] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xb] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xc] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xd] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xe] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xf] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x10] =
         &PTR__ReporterRegistry_00178ec8;
    *(undefined4 *)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 0x12) = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x13] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x14] =
         (anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 0x12;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x15] =
         (anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 0x12;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x16] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x17] =
         &PTR__ExceptionTranslatorRegistry_00178f10;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x1a] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x18] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x19] = 0;
  }
  return (IMutableRegistryHub *)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 1);
}

Assistant:

inline RegistryHub*& getTheRegistryHub() {
            static RegistryHub* theRegistryHub = NULL;
            if( !theRegistryHub )
                theRegistryHub = new RegistryHub();
            return theRegistryHub;
        }